

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

VisitError<void> * __thiscall
Fixpp::TypedParsingContext<void>::toVisitError
          (VisitError<void> *__return_storage_ptr__,TypedParsingContext<void> *this)

{
  bool bVar1;
  ErrorKind *this_00;
  ErrorKind *val;
  Err<Fixpp::ErrorKind> local_48;
  TypedParsingContext<void> *local_18;
  TypedParsingContext<void> *this_local;
  
  local_18 = this;
  this_local = (TypedParsingContext<void> *)__return_storage_ptr__;
  bVar1 = ParsingContext::hasError(&this->super_ParsingContext);
  if (bVar1) {
    this_00 = Deferred<Fixpp::ErrorKind>::get(&(this->super_ParsingContext).error);
    result::Err<Fixpp::ErrorKind_const&,Fixpp::ErrorKind>(&local_48,(result *)this_00,val);
    result::Result<void,_Fixpp::ErrorKind>::Result(__return_storage_ptr__,&local_48);
    result::types::Err<Fixpp::ErrorKind>::~Err(&local_48);
  }
  else {
    result::Ok();
    result::Result<void,_Fixpp::ErrorKind>::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

VisitError<void> toVisitError() const
        {
            if (hasError())
                return result::Err(error.get());
            return result::Ok();
        }